

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O2

bool __thiscall sshash::map::update(map *this,string *hash,string *str,string *elf)

{
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  string __hs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string ex;
  string __he;
  
  std::operator+(&__hs,hash,".str");
  std::operator+(&__he,hash,".elf");
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_d0,&__hs,0x2e);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&ex,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                  *)this,&local_d0,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d0);
  if (ex._M_string_length == 0) {
    boost::property_tree::
    string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::string_path(&local_d0,&__hs,0x2e);
    boost::property_tree::
    basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
    put<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
              ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                *)this,&local_d0,str);
    std::__cxx11::string::~string((string *)&local_d0);
    boost::property_tree::
    string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::string_path(&local_d0,&__he,0x2e);
    boost::property_tree::
    basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
    put<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
              ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                *)this,&local_d0,elf);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&ex);
  std::__cxx11::string::~string((string *)&__he);
  std::__cxx11::string::~string((string *)&__hs);
  return ex._M_string_length == 0;
}

Assistant:

bool map::update(const std::string& hash, const std::string& str, const std::string& elf)
{
	std::string __hs = hash + ".str";
	std::string __he = hash + ".elf";

	std::string ex = this->get<std::string>(__hs, std::string());
	if (!ex.empty())
		return false;

	this->put(__hs, str);
	this->put(__he, elf);

	return true;
}